

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_vars,Type type)

{
  SafeInt<int> n;
  int iVar1;
  size_type __new_size;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t new_size;
  bool in_stack_00000057;
  size_type in_stack_00000058;
  vector<bool,_std::allocator<bool>_> *in_stack_00000060;
  undefined8 in_stack_ffffffffffffffb8;
  SafeInt<int> in_stack_ffffffffffffffc0;
  Var local_30;
  undefined4 in_stack_ffffffffffffffe0;
  unsigned_long in_stack_ffffffffffffffe8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ::size((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
          *)(in_RDI + 0x168));
  SafeInt<int>::SafeInt<unsigned_long>
            ((SafeInt<int> *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  n = operator+(in_stack_ffffffffffffffc0,iVar1);
  iVar1 = mp::val(n);
  __new_size = (size_type)iVar1;
  Var::Var(&local_30,0.0,0.0);
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ::resize((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
            *)CONCAT44(in_ESI,in_EDX),__new_size,
           (value_type *)CONCAT44(n.value_,in_stack_ffffffffffffffe0));
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000060,in_stack_00000058,in_stack_00000057);
  return;
}

Assistant:

void AddVars(int num_vars, var::Type type) {
    MP_ASSERT(num_vars >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(vars_.size()) + num_vars);
    vars_.resize(new_size, Var(0, 0));
    is_var_int_.resize(new_size, type != var::CONTINUOUS);
  }